

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  element_type *this;
  ostream *poVar1;
  __shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<Liby::Channel> input_chan;
  shared_ptr<Liby::Connection> input_conn;
  shared_ptr<Liby::FileDescriptor> local_138;
  allocator local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  shared_ptr<Liby::UdpSocket> udp_client;
  UdpConnection *p_uconn;
  undefined4 local_fc;
  __shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 local_e8 [16];
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  EventLoopGroup group;
  
  if (argc != 3) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ./udp_client host service");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::__cxx11::string::string((string *)&input_chan,"EPOLL",(allocator *)&input_conn);
    Liby::EventLoopGroup::EventLoopGroup(&group,0,(string *)&input_chan);
    std::__cxx11::string::~string((string *)&input_chan);
    p_uconn = (UdpConnection *)0x0;
    std::__cxx11::string::string((string *)&input_chan,argv[1],(allocator *)&local_138);
    std::__cxx11::string::string((string *)&input_conn,argv[2],local_128);
    Liby::EventLoopGroup::creatUdpClient
              ((EventLoopGroup *)&udp_client,(string *)&group,(string *)&input_chan);
    std::__cxx11::string::~string((string *)&input_conn);
    std::__cxx11::string::~string((string *)&input_chan);
    input_chan.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    input_chan.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&p_uconn;
    std::function<void_(Liby::UdpConnection_&)>::operator=
              (&(udp_client.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->connectorCallback_,(function<void_(Liby::UdpConnection_&)> *)&input_chan);
    std::_Function_base::~_Function_base((_Function_base *)&input_chan);
    input_chan.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    input_chan.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::function<void_(Liby::UdpConnection_&)>::operator=
              (&(udp_client.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->readEventCallback_,(function<void_(Liby::UdpConnection_&)> *)&input_chan);
    std::_Function_base::~_Function_base((_Function_base *)&input_chan);
    input_conn.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)Liby::Poller::curr_thread_poller();
    local_138.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    std::make_shared<Liby::Channel,Liby::Poller*,int>((Poller **)&input_chan,(int *)&input_conn);
    local_fc = 0;
    std::make_shared<Liby::FileDescriptor,int>((int *)local_128);
    std::make_shared<Liby::Socket,std::shared_ptr<Liby::FileDescriptor>>(&local_138);
    std::make_shared<Liby::Connection,std::shared_ptr<Liby::Socket>>
              ((shared_ptr<Liby::Socket> *)&input_conn);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_138.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
    this = input_conn.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = &local_f8;
    std::__shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (this_00,&input_chan.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>);
    Liby::Connection::setChannel(this,(ChanPtr *)this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
    Liby::Connection::init
              (input_conn.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (EVP_PKEY_CTX *)this_00);
    Liby::Connection::init1
              (input_conn.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_c8._8_8_ = (pointer)0x0;
    local_b0 = std::
               _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/udp_client.cpp:33:28)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/udp_client.cpp:33:28)>
               ::_M_manager;
    local_c8._M_unused._M_object = (element_type *)&p_uconn;
    std::function<void_(Liby::Connection_&)>::operator=
              (&(input_conn.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    local_e8._0_8_ = (void *)0x0;
    local_e8._8_8_ = 0;
    local_d0 = std::
               _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
               ::_M_manager;
    Liby::EventLoopGroup::run(&group,(BoolFunctor *)local_e8);
    std::_Function_base::~_Function_base((_Function_base *)local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&input_conn.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&input_chan.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&udp_client.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    Liby::EventLoopGroup::~EventLoopGroup(&group);
  }
  return (uint)(argc != 3);
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 3) {
        cerr << "usage: ./udp_client host service" << endl;
        return 1;
    }

    try {
        EventLoopGroup group;
        UdpConnection *p_uconn = nullptr;
        auto udp_client = group.creatUdpClient(argv[1], argv[2]);
        udp_client->onConnect([&](UdpConnection &uconn) {
            p_uconn = &uconn;
            //            uconn.send(" ");
        });
        udp_client->onRead([&](UdpConnection &uconn) {
            cout << uconn.read().retriveveAllAsString() << endl;
        });
        auto input_chan =
            std::make_shared<Channel>(Poller::curr_thread_poller(), 0);
        auto input_conn = std::make_shared<Connection>(
            std::make_shared<Socket>(std::make_shared<FileDescriptor>(0)));
        input_conn->setChannel(input_chan);
        input_conn->init();
        input_conn->init1();
        input_conn->onRead([&](Connection &in) {
            if (p_uconn == nullptr)
                return;
            auto str = in.read().retriveveAllAsString();
            //            cout << "input " << str << endl;
            p_uconn->send(str, [str] {
                //                cout << "try to send " << str << endl;
            });
        });
        group.run();
    } catch (const char *err) { cerr << err << endl; }
}